

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parser_eat_all_blanks(VrplibParser *p)

{
  char *pcVar1;
  bool bVar2;
  
  pcVar1 = p->at;
  do {
    parser_eat_whitespaces(p);
    parser_eat_newline(p);
    parser_eat_whitespaces(p);
    bVar2 = p->at != pcVar1;
    pcVar1 = p->at;
  } while (bVar2);
  return;
}

Assistant:

static void parser_eat_all_blanks(VrplibParser *p) {
    char *at = NULL;
    do {
        at = p->at;
        parser_eat_whitespaces(p);
        parser_eat_newline(p);
        parser_eat_whitespaces(p);
    } while (p->at != at);
}